

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Service_Request_PDU.cpp
# Opt level: O3

KBOOL __thiscall
KDIS::PDU::Service_Request_PDU::operator==(Service_Request_PDU *this,Service_Request_PDU *Value)

{
  pointer pSVar1;
  KBOOL KVar2;
  pointer this_00;
  pointer Value_00;
  
  KVar2 = Logistics_Header::operator!=((Logistics_Header *)this,(Logistics_Header *)Value);
  if (((!KVar2) && (this->m_ui8ServiceTypeRequested == Value->m_ui8ServiceTypeRequested)) &&
     ((this->super_Resupply_Received_PDU).m_ui8NumSupplyTypes ==
      (Value->super_Resupply_Received_PDU).m_ui8NumSupplyTypes)) {
    this_00 = (this->super_Resupply_Received_PDU).m_vSupplies.
              super__Vector_base<KDIS::DATA_TYPE::Supplies,_std::allocator<KDIS::DATA_TYPE::Supplies>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pSVar1 = (this->super_Resupply_Received_PDU).m_vSupplies.
             super__Vector_base<KDIS::DATA_TYPE::Supplies,_std::allocator<KDIS::DATA_TYPE::Supplies>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    Value_00 = (Value->super_Resupply_Received_PDU).m_vSupplies.
               super__Vector_base<KDIS::DATA_TYPE::Supplies,_std::allocator<KDIS::DATA_TYPE::Supplies>_>
               ._M_impl.super__Vector_impl_data._M_start;
    if ((long)pSVar1 - (long)this_00 ==
        (long)(Value->super_Resupply_Received_PDU).m_vSupplies.
              super__Vector_base<KDIS::DATA_TYPE::Supplies,_std::allocator<KDIS::DATA_TYPE::Supplies>_>
              ._M_impl.super__Vector_impl_data._M_finish - (long)Value_00) {
      if (this_00 == pSVar1) {
        return true;
      }
      do {
        KVar2 = DATA_TYPE::Supplies::operator==(this_00,Value_00);
        if (!KVar2) break;
        this_00 = this_00 + 1;
        Value_00 = Value_00 + 1;
      } while (this_00 != pSVar1);
      if (KVar2) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

KBOOL Service_Request_PDU::operator == ( const Service_Request_PDU & Value ) const
{
    if( Logistics_Header::operator  !=( Value ) )                        return false;
    if( m_ui8ServiceTypeRequested   != Value.m_ui8ServiceTypeRequested ) return false;
    if( m_ui8NumSupplyTypes         != Value.m_ui8NumSupplyTypes )       return false;
    if( m_vSupplies                 != Value.m_vSupplies )               return false;
    return true;
}